

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

vector3f tinyusdz::vnormalize(vector3f *a,float eps)

{
  float fVar1;
  float __x;
  vector3f vVar2;
  
  __x = a->z * a->z + a->x * a->x + a->y * a->y;
  fVar1 = 0.0;
  if (1.1920929e-07 < __x) {
    if (__x < 0.0) {
      fVar1 = sqrtf(__x);
    }
    else {
      fVar1 = SQRT(__x);
    }
  }
  if (fVar1 <= eps) {
    fVar1 = eps;
  }
  vVar2.z = a->z / fVar1;
  vVar2.y = a->y / fVar1;
  vVar2.x = a->x / fVar1;
  return vVar2;
}

Assistant:

value::vector3f vnormalize(const value::vector3f &a, const float eps) {
  float len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::vector3f({a[0] / len, a[1] / len, a[2] / len});
}